

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  IMutableRegistryHub *pIVar2;
  allocator<char> local_62;
  allocator<char> local_61;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,alias,&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,tag,&local_62);
  pIVar2 = &(pSVar1->super_RegistryHub).super_IMutableRegistryHub;
  (*pIVar2->_vptr_IMutableRegistryHub[6])(pIVar2,local_40,local_60,lineInfo);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases(char const* alias, char const* tag, SourceLineInfo const& lineInfo) {
        CATCH_TRY {
            getMutableRegistryHub().registerTagAlias(alias, tag, lineInfo);
        }